

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void newmv_diff_bias(MACROBLOCKD *xd,PREDICTION_MODE this_mode,RD_STATS *this_rdc,BLOCK_SIZE bsize,
                    int mv_row,int mv_col,int speed,uint32_t spatial_variance,
                    CONTENT_STATE_SB content_state_sb)

{
  bool bVar1;
  bool bVar2;
  int left_col;
  int left_row;
  int above_col;
  int above_row;
  int left_mv_valid;
  int above_mv_valid;
  int col_diff;
  int row_diff;
  int al_mv_average_col;
  int al_mv_average_row;
  int mv_col_local;
  int mv_row_local;
  BLOCK_SIZE bsize_local;
  RD_STATS *this_rdc_local;
  PREDICTION_MODE this_mode_local;
  MACROBLOCKD *xd_local;
  
  if (this_mode == '\x10') {
    bVar1 = false;
    bVar2 = false;
    above_row = -0x8000;
    above_col = -0x8000;
    left_row = -0x8000;
    left_col = -0x8000;
    if (((bsize < BLOCK_64X64) || (content_state_sb.source_sad_nonrd == kHighSad)) ||
       ((299 < spatial_variance ||
        (((mv_row < 0x11 && (-0x11 < mv_row)) && ((mv_col < 0x11 && (-0x11 < mv_col)))))))) {
      if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
        bVar1 = xd->above_mbmi->mv[0].as_int != 0x80008000;
        above_row = (int)xd->above_mbmi->mv[0].as_mv.row;
        above_col = (int)xd->above_mbmi->mv[0].as_mv.col;
      }
      if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
        bVar2 = xd->left_mbmi->mv[0].as_int != 0x80008000;
        left_row = (int)xd->left_mbmi->mv[0].as_mv.row;
        left_col = (int)xd->left_mbmi->mv[0].as_mv.col;
      }
      if ((bVar1) && (bVar2)) {
        al_mv_average_row = above_row + left_row + 1 >> 1;
        al_mv_average_col = above_col + left_col + 1 >> 1;
      }
      else if (bVar1) {
        al_mv_average_row = above_row;
        al_mv_average_col = above_col;
      }
      else if (bVar2) {
        al_mv_average_row = left_row;
        al_mv_average_col = left_col;
      }
      else {
        al_mv_average_col = 0;
        al_mv_average_row = 0;
      }
      if ((((0x50 < al_mv_average_row - mv_row) || (al_mv_average_row - mv_row < -0x50)) ||
          (0x50 < al_mv_average_col - mv_col)) || (al_mv_average_col - mv_col < -0x50)) {
        if (bsize < BLOCK_32X32) {
          this_rdc->rdcost = this_rdc->rdcost * 5 >> 2;
        }
        else {
          this_rdc->rdcost = this_rdc->rdcost << 1;
        }
      }
    }
    else {
      this_rdc->rdcost = this_rdc->rdcost << 2;
    }
  }
  else if (((7 < speed) && (spatial_variance < 0x96)) &&
          ((0x40 < mv_row || (((mv_row < -0x40 || (0x40 < mv_col)) || (mv_col < -0x40)))))) {
    this_rdc->rdcost = this_rdc->rdcost * 5 >> 2;
  }
  return;
}

Assistant:

static void newmv_diff_bias(MACROBLOCKD *xd, PREDICTION_MODE this_mode,
                            RD_STATS *this_rdc, BLOCK_SIZE bsize, int mv_row,
                            int mv_col, int speed, uint32_t spatial_variance,
                            CONTENT_STATE_SB content_state_sb) {
  // Bias against MVs associated with NEWMV mode that are very different from
  // top/left neighbors.
  if (this_mode == NEWMV) {
    int al_mv_average_row;
    int al_mv_average_col;
    int row_diff, col_diff;
    int above_mv_valid = 0;
    int left_mv_valid = 0;
    int above_row = INVALID_MV_ROW_COL, above_col = INVALID_MV_ROW_COL;
    int left_row = INVALID_MV_ROW_COL, left_col = INVALID_MV_ROW_COL;
    if (bsize >= BLOCK_64X64 && content_state_sb.source_sad_nonrd != kHighSad &&
        spatial_variance < 300 &&
        (mv_row > 16 || mv_row < -16 || mv_col > 16 || mv_col < -16)) {
      this_rdc->rdcost = this_rdc->rdcost << 2;
      return;
    }
    if (xd->above_mbmi) {
      above_mv_valid = xd->above_mbmi->mv[0].as_int != INVALID_MV;
      above_row = xd->above_mbmi->mv[0].as_mv.row;
      above_col = xd->above_mbmi->mv[0].as_mv.col;
    }
    if (xd->left_mbmi) {
      left_mv_valid = xd->left_mbmi->mv[0].as_int != INVALID_MV;
      left_row = xd->left_mbmi->mv[0].as_mv.row;
      left_col = xd->left_mbmi->mv[0].as_mv.col;
    }
    if (above_mv_valid && left_mv_valid) {
      al_mv_average_row = (above_row + left_row + 1) >> 1;
      al_mv_average_col = (above_col + left_col + 1) >> 1;
    } else if (above_mv_valid) {
      al_mv_average_row = above_row;
      al_mv_average_col = above_col;
    } else if (left_mv_valid) {
      al_mv_average_row = left_row;
      al_mv_average_col = left_col;
    } else {
      al_mv_average_row = al_mv_average_col = 0;
    }
    row_diff = al_mv_average_row - mv_row;
    col_diff = al_mv_average_col - mv_col;
    if (row_diff > 80 || row_diff < -80 || col_diff > 80 || col_diff < -80) {
      if (bsize >= BLOCK_32X32)
        this_rdc->rdcost = this_rdc->rdcost << 1;
      else
        this_rdc->rdcost = 5 * this_rdc->rdcost >> 2;
    }
  } else {
    // Bias for speed >= 8 for low spatial variance.
    if (speed >= 8 && spatial_variance < 150 &&
        (mv_row > 64 || mv_row < -64 || mv_col > 64 || mv_col < -64))
      this_rdc->rdcost = 5 * this_rdc->rdcost >> 2;
  }
}